

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

char * __thiscall spirv_cross::CompilerMSL::to_restrict(CompilerMSL *this,uint32_t id,bool space)

{
  bool bVar1;
  Types TVar2;
  Variant *this_00;
  Bitset *pBVar3;
  char *local_108;
  bool local_e3;
  bool local_e1;
  ID local_c4;
  ID local_c0;
  VariableID local_bc;
  Bitset local_b8;
  ID local_78;
  ID local_74;
  SPIRType *local_70;
  SPIRType *type;
  uint32_t type_id;
  undefined1 local_58 [8];
  Bitset flags;
  bool space_local;
  uint32_t id_local;
  CompilerMSL *this_local;
  
  flags.higher._M_h._M_single_bucket._3_1_ = space;
  flags.higher._M_h._M_single_bucket._4_4_ = id;
  Bitset::Bitset((Bitset *)local_58);
  this_00 = VectorView<spirv_cross::Variant>::operator[]
                      (&(this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>,
                       (ulong)flags.higher._M_h._M_single_bucket._4_4_);
  TVar2 = Variant::get_type(this_00);
  if (TVar2 == TypeVariable) {
    type._0_4_ = Compiler::expression_type_id
                           ((Compiler *)this,flags.higher._M_h._M_single_bucket._4_4_);
    local_70 = Compiler::expression_type((Compiler *)this,flags.higher._M_h._M_single_bucket._4_4_);
    local_e1 = false;
    if (local_70->basetype == Struct) {
      TypedID<(spirv_cross::Types)0>::TypedID(&local_74,(uint32_t)type);
      bVar1 = Compiler::has_decoration((Compiler *)this,local_74,Block);
      local_e3 = true;
      if (!bVar1) {
        TypedID<(spirv_cross::Types)0>::TypedID(&local_78,(uint32_t)type);
        local_e3 = Compiler::has_decoration((Compiler *)this,local_78,BufferBlock);
      }
      local_e1 = local_e3;
    }
    if (local_e1 == false) {
      TypedID<(spirv_cross::Types)0>::TypedID(&local_c0,flags.higher._M_h._M_single_bucket._4_4_);
      pBVar3 = Compiler::get_decoration_bitset((Compiler *)this,local_c0);
      Bitset::operator=((Bitset *)local_58,pBVar3);
    }
    else {
      TypedID<(spirv_cross::Types)2>::TypedID(&local_bc,flags.higher._M_h._M_single_bucket._4_4_);
      Compiler::get_buffer_block_flags(&local_b8,(Compiler *)this,local_bc);
      Bitset::operator=((Bitset *)local_58,&local_b8);
      Bitset::~Bitset(&local_b8);
    }
  }
  else {
    TypedID<(spirv_cross::Types)0>::TypedID(&local_c4,flags.higher._M_h._M_single_bucket._4_4_);
    pBVar3 = Compiler::get_decoration_bitset((Compiler *)this,local_c4);
    Bitset::operator=((Bitset *)local_58,pBVar3);
  }
  bVar1 = Bitset::get((Bitset *)local_58,0x13);
  if ((bVar1) || (bVar1 = Bitset::get((Bitset *)local_58,0x14eb), bVar1)) {
    local_108 = "__restrict";
    if ((flags.higher._M_h._M_single_bucket._3_1_ & 1) != 0) {
      local_108 = "__restrict ";
    }
  }
  else {
    local_108 = "";
  }
  Bitset::~Bitset((Bitset *)local_58);
  return local_108;
}

Assistant:

const char *CompilerMSL::to_restrict(uint32_t id, bool space)
{
	// This can be called for variable pointer contexts as well, so be very careful about which method we choose.
	Bitset flags;
	if (ir.ids[id].get_type() == TypeVariable)
	{
		uint32_t type_id = expression_type_id(id);
		auto &type = expression_type(id);
		if (type.basetype == SPIRType::Struct &&
		    (has_decoration(type_id, DecorationBlock) || has_decoration(type_id, DecorationBufferBlock)))
			flags = get_buffer_block_flags(id);
		else
			flags = get_decoration_bitset(id);
	}
	else
		flags = get_decoration_bitset(id);

	return flags.get(DecorationRestrict) || flags.get(DecorationRestrictPointerEXT) ?
	       (space ? "__restrict " : "__restrict") : "";
}